

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O3

int __thiscall
TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_>::ClassId
          (TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  string local_228;
  TPZFileEqnStorage<float> local_208;
  TPZFrontNonSym<float> local_150;
  
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"TPZFrontMatrix","");
  uVar1 = Hash(&local_228);
  iVar2 = TPZAbstractFrontMatrix<float>::ClassId(&this->super_TPZAbstractFrontMatrix<float>);
  TPZFileEqnStorage<float>::TPZFileEqnStorage(&local_208);
  iVar3 = TPZFileEqnStorage<float>::ClassId(&local_208);
  TPZFrontNonSym<float>::TPZFrontNonSym(&local_150);
  iVar4 = TPZFrontNonSym<float>::ClassId(&local_150);
  TPZFrontNonSym<float>::~TPZFrontNonSym(&local_150);
  TPZFileEqnStorage<float>::~TPZFileEqnStorage(&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  return iVar4 << 3 ^ iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::ClassId() const{
    return Hash("TPZFrontMatrix") ^ TPZAbstractFrontMatrix<TVar>::ClassId() << 1 ^ store().ClassId() << 2 ^ front().ClassId() << 3;
}